

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,char *value)

{
  char cVar1;
  basic_format_specs<char> *specs;
  buffer_appender<char> bVar2;
  size_t in_RCX;
  
  specs = this->specs_;
  if (specs != (basic_format_specs<char> *)0x0) {
    cVar1 = specs->type;
    if (cVar1 != 's') {
      if (cVar1 == 'p') {
        bVar2 = write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
                          ((buffer_appender<char>)
                           (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container,(unsigned_long)value,specs);
        (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (buffer<char> *)
             bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
        goto LAB_004a467a;
      }
      if (cVar1 != '\0') {
        error_handler::on_error((error_handler *)this,"invalid type specifier");
      }
    }
  }
  write(this,(int)value,specs,in_RCX);
LAB_004a467a:
  return (iterator)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(const Char* value) {
    if (!specs_) return write(value), out_;
    handle_cstring_type_spec(specs_->type, cstring_spec_handler(*this, value));
    return out_;
  }